

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O2

xmlNodePtr xmlNextElementSibling(xmlNodePtr node)

{
  xmlNodePtr pxVar1;
  
  if (node == (xmlNodePtr)0x0) {
    return (xmlNodePtr)0x0;
  }
  pxVar1 = (xmlNodePtr)0x0;
  if ((node->type < (XML_XINCLUDE_END|XML_ELEMENT_NODE)) &&
     ((0x1841baU >> (node->type & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) != 0)) {
    do {
      pxVar1 = node->next;
      if (pxVar1 == (xmlNodePtr)0x0) {
        return (xmlNodePtr)0x0;
      }
      node = pxVar1;
    } while (pxVar1->type != XML_ELEMENT_NODE);
  }
  return pxVar1;
}

Assistant:

xmlNodePtr
xmlNextElementSibling(xmlNodePtr node) {
    if (node == NULL)
        return(NULL);
    switch (node->type) {
        case XML_ELEMENT_NODE:
        case XML_TEXT_NODE:
        case XML_CDATA_SECTION_NODE:
        case XML_ENTITY_REF_NODE:
        case XML_PI_NODE:
        case XML_COMMENT_NODE:
        case XML_DTD_NODE:
        case XML_XINCLUDE_START:
        case XML_XINCLUDE_END:
            node = node->next;
            break;
        default:
            return(NULL);
    }
    while (node != NULL) {
        if (node->type == XML_ELEMENT_NODE)
            return(node);
        node = node->next;
    }
    return(NULL);
}